

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O1

bool __thiscall FButtonStatus::ReleaseKey(FButtonStatus *this,int keynum)

{
  BYTE BVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  BVar1 = this->bDown;
  if ((keynum & 0x7fffU) == 0) {
    this->Keys[4] = 0;
    this->Keys[5] = 0;
    this->Keys[0] = 0;
    this->Keys[1] = 0;
    this->Keys[2] = 0;
    this->Keys[3] = 0;
    this->bWentUp = '\x01';
  }
  else {
    iVar2 = 0;
    uVar3 = 0xffffffff;
    uVar4 = 5;
    do {
      iVar2 = (iVar2 + 1) - (uint)(this->Keys[uVar4] == 0);
      if ((keynum & 0x7fffU) == (uint)this->Keys[uVar4]) {
        uVar3 = uVar4 & 0xffffffff;
      }
      bVar5 = uVar4 != 0;
      uVar4 = uVar4 - 1;
    } while (bVar5);
    if ((int)uVar3 < 0) {
      return false;
    }
    this->Keys[uVar3] = 0;
    this->bWentUp = '\x01';
    if (iVar2 != 1) goto LAB_003581b0;
  }
  this->bDown = '\0';
LAB_003581b0:
  return this->bDown == '\0' && BVar1 != '\0';
}

Assistant:

bool FButtonStatus::ReleaseKey (int keynum)
{
	int i, numdown, match;
	BYTE wasdown = bDown;

	keynum &= KEY_DBLCLICKED-1;

	if (keynum == 0)
	{ // Issued from console instead of a key, so force off
		for (i = MAX_KEYS-1; i >= 0; --i)
		{
			Keys[i] = 0;
		}
		bWentUp = true;
		bDown = false;
	}
	else
	{
		for (i = MAX_KEYS-1, numdown = 0, match = -1; i >= 0; --i)
		{
			if (Keys[i] != 0)
			{
				++numdown;
				if (Keys[i] == keynum)
				{
					match = i;
				}
			}
		}
		if (match < 0)
		{ // Key was not down; do nothing
			return false;
		}
		Keys[match] = 0;
		bWentUp = true;
		if (--numdown == 0)
		{
			bDown = false;
		}
	}
	// Returns true if releasing this key caused the button to go up.
	return wasdown && !bDown;
}